

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall Channel::handleEvent(Channel *this)

{
  uint uVar1;
  long lVar2;
  __shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  ChannelPtr guard;
  
  if (this->fd_ == -1) {
    return;
  }
  std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
            (local_20,(__weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)this);
  uVar1 = this->revents_;
  if (((uVar1 & 0x11) == 0x10) &&
     ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->closeCallback_);
    uVar1 = this->revents_;
  }
  if ((uVar1 & 8) != 0) {
    if ((this->errorCallback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      lVar2 = 0x88;
      if ((this->closeCallback_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0012477b;
    }
    else {
      lVar2 = 0x68;
    }
    std::function<void_()>::operator()
              ((function<void_()> *)
               ((long)&(this->super_enable_shared_from_this<Channel>)._M_weak_this.
                       super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar2));
  }
LAB_0012477b:
  uVar1 = this->revents_;
  if (((uVar1 & 0x2003) != 0) &&
     ((this->readCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->readCallback_);
    uVar1 = this->revents_;
  }
  if (((uVar1 & 4) != 0) &&
     ((this->writeCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->writeCallback_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard);
  return;
}

Assistant:

void Channel::handleEvent() {
    if (fd_ == -1) return;
    ChannelPtr guard(shared_from_this());
    if ((revents_ & EPOLLHUP) && !(revents_ & EPOLLIN)) {
        if(closeCallback_) closeCallback_();
    }
    if (revents_ & EPOLLERR) {
        if (errorCallback_) errorCallback_();
        else if (closeCallback_) closeCallback_();
    }
    if (revents_ & (EPOLLIN | EPOLLPRI | EPOLLRDHUP)) {
        if(readCallback_) readCallback_();
    }
    if(revents_ & EPOLLOUT) {
        if(writeCallback_) writeCallback_();
    }
}